

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPSTATAccessories(ndicapi *pol,int port)

{
  char cVar1;
  uint uVar2;
  char (*pacVar3) [2];
  int i;
  long lVar4;
  int iVar5;
  
  if (port - 0x31U < 3) {
    pacVar3 = pol->PstatAccessories + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    pacVar3 = pol->PstatPassiveAccessories + (port - 0x41U);
  }
  if ((*pacVar3)[0] == '\0') {
    return 0;
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    cVar1 = (*pacVar3)[lVar4];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | iVar5 + cVar1;
    lVar4 = lVar4 + 1;
    if (lVar4 == 2) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiGetPSTATAccessories(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatAccessories[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveAccessories[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}